

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O1

double __thiscall
HighsMipSolverData::transformNewIntegerFeasibleSolution
          (HighsMipSolverData *this,vector<double,_std::allocator<double>_> *sol,
          bool possibly_store_as_new_incumbent)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pHVar2;
  HighsCallback *this_00;
  HighsMipSolver *pHVar3;
  pointer pdVar4;
  double dVar5;
  double dVar6;
  pointer pdVar7;
  pointer pdVar8;
  HighsInt HVar9;
  bool bVar10;
  bool bVar11;
  vector<double,_std::allocator<double>_> *pass_row_value;
  undefined7 in_register_00000011;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar15;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar16;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double dVar17;
  double dVar18;
  double integrality_violation_;
  double row_violation_;
  double bound_violation_;
  HighsMipSolver *local_5a08;
  uint local_59fc;
  undefined1 local_59f8 [16];
  HighsCDouble local_59e8;
  string local_59d8;
  HighsMipSolverData *local_59b8;
  double local_59b0;
  HighsSolution local_59a8;
  string local_5940;
  HighsLp fixedModel;
  HighsLp local_5588;
  Highs tmpSolver;
  
  uVar14 = CONCAT71(in_register_00000011,possibly_store_as_new_incumbent) & 0xffffffff;
  local_59a8.value_valid = false;
  local_59a8.dual_valid = false;
  local_59a8.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (double *)0x0;
  local_59a8.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_59a8.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_59a8.col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_59a8.col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_59a8.col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_59a8.row_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_59a8.row_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_59a8.row_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_59a8.row_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_59a8.row_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_59a8.row_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::operator=(&local_59a8.col_value,sol);
  local_59a8.value_valid = true;
  presolve::HighsPostsolveStack::undoPrimal
            (&this->postSolveStack,this->mipsolver->options_mip_,&local_59a8,-1);
  calculateRowValuesQuad(this->mipsolver->orig_model_,&local_59a8,-1);
  dVar18 = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
  bVar10 = true;
  local_59fc = (uint)CONCAT71(in_register_00000011,possibly_store_as_new_incumbent);
  uVar15 = extraout_XMM0_Dc;
  uVar16 = extraout_XMM0_Dd;
  local_59b8 = this;
  do {
    pass_row_value = &local_59a8.row_value;
    local_59f8._8_4_ = uVar15;
    local_59f8._0_8_ = dVar18;
    local_59f8._12_4_ = uVar16;
    bound_violation_ = 0.0;
    row_violation_ = 0.0;
    integrality_violation_ = 0.0;
    local_59e8.hi = 0.0;
    local_59e8.lo = 0.0;
    bVar11 = HighsMipSolver::solutionFeasible
                       (this->mipsolver,this->mipsolver->orig_model_,&local_59a8.col_value,
                        pass_row_value,&bound_violation_,&row_violation_,&integrality_violation_,
                        &local_59e8);
    dVar5 = local_59e8.hi + local_59e8.lo;
    if ((bVar11) || (!bVar10)) {
LAB_002bef37:
      if ((((bVar11) && (this->mipsolver->submip == false)) &&
          (this_00 = this->mipsolver->callback_,
          (this_00->user_callback).super__Function_base._M_manager != (_Manager_type)0x0)) &&
         ((*(this_00->active).super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p & 8) != 0)) {
        HighsCallback::clearHighsCallbackDataOut(this_00);
        (this->mipsolver->callback_->data_out).mip_solution =
             local_59a8.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_5940._M_dataplus._M_p = (pointer)&local_5940.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_5940,"Feasible solution","");
        interruptFromCallbackWithData(this,3,dVar5,&local_5940);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5940._M_dataplus._M_p != &local_5940.field_2) {
          operator_delete(local_5940._M_dataplus._M_p);
        }
      }
      if ((char)uVar14 != '\0') {
        if (!bVar11) {
          pHVar3 = this->mipsolver;
          if (((INFINITY <= pHVar3->solution_objective_) ||
              (dVar18 = (pHVar3->options_mip_->super_HighsOptionsStruct).mip_feasibility_tolerance,
              dVar18 < pHVar3->bound_violation_)) || (dVar18 < pHVar3->integrality_violation_)) {
            bVar11 = false;
          }
          else {
            bVar11 = pHVar3->row_violation_ <= dVar18;
          }
          highsLogUser(&(pHVar3->options_mip_->super_HighsOptionsStruct).log_options,kWarning,
                       "Solution with objective %g has untransformed violations: bound = %.4g; integrality = %.4g; row = %.4g\n"
                       ,SUB84(dVar5,0),bound_violation_,integrality_violation_,row_violation_);
          iVar12 = 1;
          if (bVar11) {
            dVar18 = INFINITY;
            uVar15 = 0;
            uVar16 = 0;
          }
          else {
            pHVar3 = this->mipsolver;
            pHVar3->row_violation_ = row_violation_;
            pHVar3->bound_violation_ = bound_violation_;
            pHVar3->integrality_violation_ = integrality_violation_;
            pdVar4 = (pHVar3->solution_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                     .super__Vector_impl_data._M_start;
            (pHVar3->solution_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start =
                 local_59a8.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
            (pHVar3->solution_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_59a8.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            (pHVar3->solution_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 local_59a8.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
            local_59a8.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start = (double *)0x0;
            local_59a8.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_59a8.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            if (pdVar4 != (pointer)0x0) {
              operator_delete(pdVar4);
            }
            this->mipsolver->solution_objective_ = dVar5;
            dVar18 = INFINITY;
            uVar15 = 0;
            uVar16 = 0;
          }
          goto LAB_002bf105;
        }
        pHVar3 = this->mipsolver;
        pHVar3->row_violation_ = row_violation_;
        pHVar3->bound_violation_ = bound_violation_;
        pHVar3->integrality_violation_ = integrality_violation_;
        pdVar4 = (pHVar3->solution_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        (pHVar3->solution_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_59a8.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
        (pHVar3->solution_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_59a8.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
        (pHVar3->solution_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_59a8.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        local_59a8.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = (double *)0x0;
        local_59a8.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_59a8.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (pdVar4 != (pointer)0x0) {
          operator_delete(pdVar4);
        }
        this->mipsolver->solution_objective_ = dVar5;
      }
      dVar5 = this->mipsolver->model_->offset_;
      uVar16 = DAT_003c50b0._12_4_;
      if (this->mipsolver->orig_model_->sense_ == kMaximize) {
        dVar18 = dVar5 + local_59e8.hi;
        dVar18 = (double)((ulong)((dVar5 - (dVar18 - local_59e8.hi)) +
                                  (local_59e8.hi - (dVar18 - (dVar18 - local_59e8.hi))) +
                                  local_59e8.lo + dVar18) ^ (ulong)DAT_003c50b0);
      }
      else {
        dVar18 = local_59e8.hi - dVar5;
        dVar18 = ((double)((ulong)dVar5 ^ (ulong)DAT_003c50b0) - (dVar18 - local_59e8.hi)) +
                 (local_59e8.hi - (dVar18 - (dVar18 - local_59e8.hi))) + local_59e8.lo + dVar18;
      }
      uVar15 = DAT_003c50b0._8_4_;
      iVar12 = 1;
    }
    else {
      HighsLp::HighsLp(&fixedModel,this->mipsolver->orig_model_);
      pdVar8 = fixedModel.col_upper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar7 = fixedModel.col_lower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar4 = local_59a8.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (fixedModel.integrality_.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          fixedModel.integrality_.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        fixedModel.integrality_.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             fixedModel.integrality_.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>
             ._M_impl.super__Vector_impl_data._M_start;
      }
      local_5a08 = this->mipsolver;
      uVar14 = (ulong)(uint)local_5a08->orig_model_->num_col_;
      __buf = extraout_RDX;
      if (uVar14 != 0) {
        pHVar2 = (local_5a08->orig_model_->integrality_).
                 super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar13 = 0;
        do {
          if (pHVar2[uVar13] == kInteger) {
            dVar6 = round(pdVar4[uVar13]);
            uVar15 = SUB84(dVar6,0);
            uVar16 = (undefined4)((ulong)dVar6 >> 0x20);
            dVar18 = pdVar7[uVar13];
            dVar17 = dVar6;
            if (dVar6 <= dVar18) {
              dVar17 = dVar18;
            }
            pdVar7[uVar13] = dVar17;
            dVar18 = pdVar8[uVar13];
            if (dVar18 <= dVar6) {
              uVar15 = SUB84(dVar18,0);
              uVar16 = (undefined4)((ulong)dVar18 >> 0x20);
            }
            pdVar8[uVar13] = (double)CONCAT44(uVar16,uVar15);
            __buf = extraout_RDX_00;
          }
          uVar13 = uVar13 + 1;
        } while (uVar14 != uVar13);
      }
      this = local_59b8;
      local_59b8->total_repair_lp = local_59b8->total_repair_lp + 1;
      local_59b0 = (local_5a08->options_mip_->super_HighsOptionsStruct).time_limit;
      HighsTimer::read(&local_5a08->timer_,0,__buf,(size_t)pass_row_value);
      local_5a08 = (HighsMipSolver *)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
      Highs::Highs(&tmpSolver);
      paVar1 = &local_59d8.field_2;
      local_59d8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_59d8,"output_flag","");
      Highs::setOptionValue(&tmpSolver,&local_59d8,false);
      uVar14 = (ulong)local_59fc;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_59d8._M_dataplus._M_p != paVar1) {
        operator_delete(local_59d8._M_dataplus._M_p);
      }
      local_59d8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_59d8,"time_limit","");
      dVar18 = 0.1;
      if (0.1 <= local_59b0 - (double)local_5a08) {
        dVar18 = local_59b0 - (double)local_5a08;
      }
      Highs::setOptionValue(&tmpSolver,&local_59d8,dVar18);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_59d8._M_dataplus._M_p != paVar1) {
        operator_delete(local_59d8._M_dataplus._M_p);
      }
      local_59d8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_59d8,"primal_feasibility_tolerance","");
      Highs::setOptionValue
                (&tmpSolver,&local_59d8,
                 (this->mipsolver->options_mip_->super_HighsOptionsStruct).mip_feasibility_tolerance
                );
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_59d8._M_dataplus._M_p != paVar1) {
        operator_delete(local_59d8._M_dataplus._M_p);
      }
      if ((this->mipsolver->options_mip_->super_HighsOptionsStruct).mip_root_presolve_only == true)
      {
        local_59d8._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_59d8,"presolve","");
        Highs::setOptionValue(&tmpSolver,&local_59d8,&::kHighsOffString_abi_cxx11_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_59d8._M_dataplus._M_p != paVar1) {
          operator_delete(local_59d8._M_dataplus._M_p);
        }
      }
      HighsLp::HighsLp(&local_5588,&fixedModel);
      Highs::passModel(&tmpSolver,&local_5588);
      HighsLp::~HighsLp(&local_5588);
      HighsMipAnalysis::mipTimerStart(&this->mipsolver->analysis_,0x3a);
      Highs::run(&tmpSolver);
      HighsMipAnalysis::mipTimerStop(&this->mipsolver->analysis_,0x3a);
      HVar9 = tmpSolver.info_.super_HighsInfoStruct.primal_solution_status;
      this->total_repair_lp_iterations =
           (long)tmpSolver.info_.super_HighsInfoStruct.simplex_iteration_count;
      iVar12 = 0;
      if (tmpSolver.info_.super_HighsInfoStruct.primal_solution_status == 2) {
        this->total_repair_lp_feasible = this->total_repair_lp_feasible + 1;
        local_59a8.value_valid = tmpSolver.solution_.value_valid;
        local_59a8.dual_valid = tmpSolver.solution_.dual_valid;
        std::vector<double,_std::allocator<double>_>::operator=
                  (&local_59a8.col_value,&tmpSolver.solution_.col_value);
        std::vector<double,_std::allocator<double>_>::operator=
                  (&local_59a8.col_dual,&tmpSolver.solution_.col_dual);
        std::vector<double,_std::allocator<double>_>::operator=
                  (&local_59a8.row_value,&tmpSolver.solution_.row_value);
        std::vector<double,_std::allocator<double>_>::operator=
                  (&local_59a8.row_dual,&tmpSolver.solution_.row_dual);
        iVar12 = 2;
        bVar10 = false;
      }
      Highs::~Highs(&tmpSolver);
      HighsLp::~HighsLp(&fixedModel);
      dVar18 = local_59f8._0_8_;
      uVar15 = local_59f8._8_4_;
      uVar16 = local_59f8._12_4_;
      if (HVar9 != 2) goto LAB_002bef37;
    }
LAB_002bf105:
    if (iVar12 != 2) {
      local_59f8._8_4_ = uVar15;
      local_59f8._0_8_ = dVar18;
      local_59f8._12_4_ = uVar16;
      if (local_59a8.row_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_59a8.row_dual.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start);
        dVar18 = (double)local_59f8._0_8_;
      }
      if (local_59a8.row_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_59a8.row_value.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start);
        dVar18 = (double)local_59f8._0_8_;
      }
      if (local_59a8.col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_59a8.col_dual.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start);
        dVar18 = (double)local_59f8._0_8_;
      }
      if (local_59a8.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (double *)0x0) {
        operator_delete(local_59a8.col_value.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start);
        dVar18 = (double)local_59f8._0_8_;
      }
      return dVar18;
    }
  } while( true );
}

Assistant:

double HighsMipSolverData::transformNewIntegerFeasibleSolution(
    const std::vector<double>& sol,
    const bool possibly_store_as_new_incumbent) {
  HighsSolution solution;
  solution.col_value = sol;
  solution.value_valid = true;
  // Perform primal postsolve to get the original column values
  postSolveStack.undoPrimal(*mipsolver.options_mip_, solution);
  // Determine the row values, as they aren't computed in primal
  // postsolve
  HighsStatus return_status =
      calculateRowValuesQuad(*mipsolver.orig_model_, solution);
  if (kAllowDeveloperAssert) assert(return_status == HighsStatus::kOk);
  bool allow_try_again = true;
try_again:

  // compute the objective value in the original space
  double bound_violation_ = 0;
  double row_violation_ = 0;
  double integrality_violation_ = 0;
  HighsCDouble mipsolver_quad_objective_value = 0;
  bool feasible = mipsolver.solutionFeasible(
      mipsolver.orig_model_, solution.col_value, &solution.row_value,
      bound_violation_, row_violation_, integrality_violation_,
      mipsolver_quad_objective_value);
  double mipsolver_objective_value = double(mipsolver_quad_objective_value);
  if (!feasible && allow_try_again) {
    // printf(
    //     "trying to repair sol that is violated by %.12g bounds, %.12g "
    //     "integrality, %.12g rows\n",
    //     bound_violation_, integrality_violation_, row_violation_);
    HighsLp fixedModel = *mipsolver.orig_model_;
    fixedModel.integrality_.clear();
    for (HighsInt i = 0; i != mipsolver.orig_model_->num_col_; ++i) {
      if (mipsolver.orig_model_->integrality_[i] == HighsVarType::kInteger) {
        double solval = std::round(solution.col_value[i]);
        fixedModel.col_lower_[i] = std::max(fixedModel.col_lower_[i], solval);
        fixedModel.col_upper_[i] = std::min(fixedModel.col_upper_[i], solval);
      }
    }
    this->total_repair_lp++;
    double time_available = std::max(
        mipsolver.options_mip_->time_limit - mipsolver.timer_.read(), 0.1);
    Highs tmpSolver;
    const bool debug_report = false;
    if (debug_report) {
      tmpSolver.setOptionValue("log_dev_level", 2);
      tmpSolver.setOptionValue("highs_analysis_level", 4);
    } else {
      tmpSolver.setOptionValue("output_flag", false);
    }
    // tmpSolver.setOptionValue("simplex_scale_strategy", 0);
    // tmpSolver.setOptionValue("presolve", kHighsOffString);
    tmpSolver.setOptionValue("time_limit", time_available);
    tmpSolver.setOptionValue("primal_feasibility_tolerance",
                             mipsolver.options_mip_->mip_feasibility_tolerance);
    // check if only root presolve is allowed
    if (mipsolver.options_mip_->mip_root_presolve_only)
      tmpSolver.setOptionValue("presolve", kHighsOffString);
    tmpSolver.passModel(std::move(fixedModel));
    mipsolver.analysis_.mipTimerStart(kMipClockSimplexNoBasisSolveLp);
    tmpSolver.run();
    mipsolver.analysis_.mipTimerStop(kMipClockSimplexNoBasisSolveLp);

    this->total_repair_lp_iterations =
        tmpSolver.getInfo().simplex_iteration_count;
    if (tmpSolver.getInfo().primal_solution_status == kSolutionStatusFeasible) {
      this->total_repair_lp_feasible++;
      solution = tmpSolver.getSolution();
      allow_try_again = false;
      goto try_again;
    }
  }

  // Possible MIP solution callback
  if (!mipsolver.submip && feasible && mipsolver.callback_->user_callback &&
      mipsolver.callback_->active[kCallbackMipSolution]) {
    mipsolver.callback_->clearHighsCallbackDataOut();
    mipsolver.callback_->data_out.mip_solution = solution.col_value.data();
    const bool interrupt = interruptFromCallbackWithData(
        kCallbackMipSolution, mipsolver_objective_value, "Feasible solution");
    assert(!interrupt);
  }

  if (possibly_store_as_new_incumbent) {
    // Store the solution as incumbent in the original space if there
    // is no solution or if it is feasible
    if (feasible) {
      // if (!allow_try_again)
      //   printf("repaired solution with value %g\n",
      //   mipsolver_objective_value);
      // store
      mipsolver.row_violation_ = row_violation_;
      mipsolver.bound_violation_ = bound_violation_;
      mipsolver.integrality_violation_ = integrality_violation_;
      mipsolver.solution_ = std::move(solution.col_value);
      mipsolver.solution_objective_ = mipsolver_objective_value;
    } else {
      bool currentFeasible =
          mipsolver.solution_objective_ != kHighsInf &&
          mipsolver.bound_violation_ <=
              mipsolver.options_mip_->mip_feasibility_tolerance &&
          mipsolver.integrality_violation_ <=
              mipsolver.options_mip_->mip_feasibility_tolerance &&
          mipsolver.row_violation_ <=
              mipsolver.options_mip_->mip_feasibility_tolerance;
      highsLogUser(mipsolver.options_mip_->log_options, HighsLogType::kWarning,
                   "Solution with objective %g has untransformed violations: "
                   "bound = %.4g; integrality = %.4g; row = %.4g\n",
                   mipsolver_objective_value, bound_violation_,
                   integrality_violation_, row_violation_);
      if (!currentFeasible) {
        // if the current incumbent is non existent or also not feasible we
        // still store the new one
        mipsolver.row_violation_ = row_violation_;
        mipsolver.bound_violation_ = bound_violation_;
        mipsolver.integrality_violation_ = integrality_violation_;
        mipsolver.solution_ = std::move(solution.col_value);
        mipsolver.solution_objective_ = mipsolver_objective_value;
      }

      // return infinity so that it is not used for bounding
      return kHighsInf;
    }
  }
  // return the objective value in the transformed space
  if (mipsolver.orig_model_->sense_ == ObjSense::kMaximize)
    return -double(mipsolver_quad_objective_value + mipsolver.model_->offset_);

  return double(mipsolver_quad_objective_value - mipsolver.model_->offset_);
}